

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O2

dynamic_string __thiscall crnlib::operator+(crnlib *this,dynamic_string *a,dynamic_string *b)

{
  char *extraout_RDX;
  dynamic_string dVar1;
  dynamic_string dStack_28;
  
  dynamic_string::dynamic_string(&dStack_28,a);
  dynamic_string::append(&dStack_28,b);
  dynamic_string::dynamic_string((dynamic_string *)this,&dStack_28);
  dynamic_string::~dynamic_string(&dStack_28);
  dVar1.m_pStr = extraout_RDX;
  dVar1._0_8_ = this;
  return dVar1;
}

Assistant:

dynamic_string operator+(const dynamic_string& a, const dynamic_string& b) {
  return dynamic_string(a).append(b);
}